

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

void av1_copy_frame_mvs(AV1_COMMON *cm,MB_MODE_INFO *mi,int mi_row,int mi_col,int x_mis,int y_mis)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  MV_REF *pMVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  MV_REF *pMVar11;
  ushort uVar12;
  long lVar13;
  
  iVar8 = y_mis + 1 >> 1;
  if (0 < iVar8) {
    iVar7 = x_mis + 1 >> 1;
    iVar9 = (cm->mi_params).mi_cols + 1 >> 1;
    pMVar4 = cm->cur_frame->mvs + (long)((mi_row >> 1) * iVar9) + (long)(mi_col >> 1);
    iVar5 = 0;
    do {
      if (0 < iVar7) {
        iVar10 = 0;
        pMVar11 = pMVar4;
        do {
          pMVar11->ref_frame = -1;
          (pMVar11->mv).as_int = 0;
          lVar13 = 0;
          bVar3 = true;
          do {
            bVar6 = bVar3;
            cVar1 = mi->ref_frame[lVar13];
            if ((0 < (long)cVar1) && (cm->ref_frame_side[cVar1] == '\0')) {
              uVar2 = mi->mv[lVar13].as_mv.row;
              uVar12 = -uVar2;
              if (0 < (short)uVar2) {
                uVar12 = uVar2;
              }
              if (uVar12 < 0x1000) {
                uVar2 = *(ushort *)((long)mi->mv + lVar13 * 4 + 2);
                uVar12 = -uVar2;
                if (0 < (short)uVar2) {
                  uVar12 = uVar2;
                }
                if (uVar12 < 0x1000) {
                  pMVar11->ref_frame = cVar1;
                  pMVar11->mv = mi->mv[lVar13];
                }
              }
            }
            lVar13 = 1;
            bVar3 = false;
          } while (bVar6);
          pMVar11 = pMVar11 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar7);
      }
      pMVar4 = pMVar4 + iVar9;
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar8);
  }
  return;
}

Assistant:

void av1_copy_frame_mvs(const AV1_COMMON *const cm,
                        const MB_MODE_INFO *const mi, int mi_row, int mi_col,
                        int x_mis, int y_mis) {
  const int frame_mvs_stride = ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, 1);
  MV_REF *frame_mvs =
      cm->cur_frame->mvs + (mi_row >> 1) * frame_mvs_stride + (mi_col >> 1);
  x_mis = ROUND_POWER_OF_TWO(x_mis, 1);
  y_mis = ROUND_POWER_OF_TWO(y_mis, 1);
  int w, h;

  for (h = 0; h < y_mis; h++) {
    MV_REF *mv = frame_mvs;
    for (w = 0; w < x_mis; w++) {
      mv->ref_frame = NONE_FRAME;
      mv->mv.as_int = 0;

      for (int idx = 0; idx < 2; ++idx) {
        MV_REFERENCE_FRAME ref_frame = mi->ref_frame[idx];
        if (ref_frame > INTRA_FRAME) {
          int8_t ref_idx = cm->ref_frame_side[ref_frame];
          if (ref_idx) continue;
          if ((abs(mi->mv[idx].as_mv.row) > REFMVS_LIMIT) ||
              (abs(mi->mv[idx].as_mv.col) > REFMVS_LIMIT))
            continue;
          mv->ref_frame = ref_frame;
          mv->mv.as_int = mi->mv[idx].as_int;
        }
      }
      mv++;
    }
    frame_mvs += frame_mvs_stride;
  }
}